

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

char * lowstring(char *i)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  
  cVar4 = *i;
  pcVar1 = lowstring::lowbuf;
  if (cVar4 != '\0') {
    lVar3 = 1;
    do {
      cVar5 = cVar4 + ' ';
      if (0x19 < (byte)(cVar4 + 0xbfU)) {
        cVar5 = cVar4;
      }
      *pcVar1 = cVar5;
      pcVar1 = pcVar1 + 1;
      cVar4 = i[lVar3];
    } while ((cVar4 != '\0') && (uVar2 = (uint)lVar3, lVar3 = lVar3 + 1, uVar2 < 0x11ff));
  }
  *pcVar1 = '\0';
  return lowstring::lowbuf;
}

Assistant:

const char *lowstring(const char *i)
{
	static char lowbuf[MAX_STRING_LENGTH];
	char *o;

	for (o = lowbuf; *i && (unsigned int)(o - lowbuf) < sizeof(lowbuf) - 1; i++, o++)
	{
		*o = LOWER(*i);
	}

	*o = '\0';
	return lowbuf;
}